

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::PopFunctionBlockerBarrier(cmMakefile *this,bool reportError)

{
  __uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *p_Var1;
  __uniq_ptr_data<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>,_true,_true> _Var2;
  reference pvVar3;
  pointer this_00;
  cmListFileContext *lfc_00;
  ostream *poVar4;
  string local_1d8;
  undefined1 local_1b8 [8];
  ostringstream e;
  cmListFileContext *lfc;
  unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> local_28;
  unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> fb;
  size_type barrier;
  bool reportError_local;
  cmMakefile *this_local;
  
  p_Var1 = (__uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                     (&this->FunctionBlockerBarriers);
  fb._M_t.super___uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>._M_t.
  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
  super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
       *(__uniq_ptr_data<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>,_true,_true> *)
        &p_Var1->_M_t;
  barrier._7_1_ = reportError;
  while( true ) {
    _Var2.super___uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>._M_t.
    super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
    super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
         (__uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>)
         std::
         stack<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::vector<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::allocator<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>_>_>_>
         ::size(&this->FunctionBlockers);
    if ((ulong)_Var2.
               super___uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
               super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl <=
        (ulong)fb._M_t.
               super___uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
               super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl) break;
    pvVar3 = std::
             stack<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::vector<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::allocator<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>_>_>_>
             ::top(&this->FunctionBlockers);
    std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>::unique_ptr
              (&local_28,pvVar3);
    std::
    stack<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::vector<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::allocator<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>_>_>_>
    ::pop(&this->FunctionBlockers);
    if ((barrier._7_1_ & 1) != 0) {
      this_00 = std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>::
                operator->(&local_28);
      lfc_00 = cmFunctionBlocker::GetStartingContext(this_00);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      poVar4 = std::operator<<((ostream *)local_1b8,"A logical block opening on the line\n");
      poVar4 = std::operator<<(poVar4,"  ");
      poVar4 = ::operator<<(poVar4,lfc_00);
      poVar4 = std::operator<<(poVar4,"\n");
      std::operator<<(poVar4,"is not closed.");
      std::__cxx11::ostringstream::str();
      IssueMessage(this,FATAL_ERROR,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      barrier._7_1_ = 0;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
    }
    std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>::~unique_ptr
              (&local_28);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
            (&this->FunctionBlockerBarriers);
  return;
}

Assistant:

void cmMakefile::PopFunctionBlockerBarrier(bool reportError)
{
  // Remove any extra entries pushed on the barrier.
  FunctionBlockersType::size_type barrier =
    this->FunctionBlockerBarriers.back();
  while (this->FunctionBlockers.size() > barrier) {
    std::unique_ptr<cmFunctionBlocker> fb(
      std::move(this->FunctionBlockers.top()));
    this->FunctionBlockers.pop();
    if (reportError) {
      // Report the context in which the unclosed block was opened.
      cmListFileContext const& lfc = fb->GetStartingContext();
      std::ostringstream e;
      /* clang-format off */
      e << "A logical block opening on the line\n"
        << "  " << lfc << "\n"
        << "is not closed.";
      /* clang-format on */
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      reportError = false;
    }
  }

  // Remove the barrier.
  this->FunctionBlockerBarriers.pop_back();
}